

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcscan.c
# Opt level: O0

int gcscan2(int probe)

{
  htlinkptr *htlptr;
  int probe_local;
  
  htlptr._0_4_ = probe;
  do {
    htlptr._0_4_ = (int)htlptr + -1;
    if ((int)htlptr < 0) {
      return -1;
    }
  } while ((HTmain[(int)htlptr] & 0x10001) == 0);
  return (int)htlptr;
}

Assistant:

int gcscan2(int probe)
/* probe is offset */
{
  struct htlinkptr *htlptr; /* overlay access method */
  while (--probe >= 0)               /* End of HTmain Table ? */
  {
    htlptr = (struct htlinkptr *)(HTmain + probe);
    /* Start addr. of scanning */
    if (((HTSTKBIT | 1) & ((struct htlinkptr *)GCPTR(htlptr))->contents) != 0)
      return (probe); /* stackref or collision ON */
  }
  return (-1);
}